

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCex.c
# Opt level: O1

Abc_Cex_t *
Bmc_CexCareSatBasedMinimizeAig(Gia_Man_t *p,Abc_Cex_t *pCex,int fHighEffort,int fVerbose)

{
  undefined4 uVar1;
  sat_solver *psVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  uint *__ptr;
  void *__dest;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  char *pcVar11;
  long lVar12;
  int iVar13;
  timespec ts;
  int iLit;
  timespec local_90;
  uint local_7c;
  Abc_Cex_t *local_78;
  Vec_Int_t *local_70;
  int local_64;
  ulong local_60;
  sat_solver *local_58;
  ulong local_50;
  int local_48;
  lit local_44;
  Cnf_Dat_t *local_40;
  Gia_Man_t *local_38;
  
  local_48 = fHighEffort;
  clock_gettime(3,&local_90);
  iVar3 = clock_gettime(3,&local_90);
  if (iVar3 < 0) {
    lVar9 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_90.tv_nsec),8);
    lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_90.tv_sec * -1000000;
  }
  local_78 = Bmc_CexCareMinimizeAig(p,p->vCis->nSize - p->nRegs,pCex,1,1,fVerbose);
  uVar10 = local_78->nRegs;
  local_7c = 0;
  if ((int)uVar10 < local_78->nBits) {
    local_7c = 0;
    do {
      local_7c = local_7c +
                 (((uint)(&local_78[1].iPo)[(int)uVar10 >> 5] >> (uVar10 & 0x1f) & 1) != 0);
      uVar10 = uVar10 + 1;
    } while (local_78->nBits != uVar10);
  }
  if (fVerbose != 0) {
    printf("Care bits = %d. ",(ulong)local_7c);
    iVar4 = 3;
    iVar3 = clock_gettime(3,&local_90);
    if (iVar3 < 0) {
      lVar12 = -1;
    }
    else {
      lVar12 = local_90.tv_nsec / 1000 + local_90.tv_sec * 1000000;
    }
    Abc_Print(iVar4,"%s =","Non-SAT-based CEX minimization");
    Abc_Print(iVar4,"%9.2f sec\n",(double)(lVar12 + lVar9) / 1000000.0);
  }
  iVar3 = clock_gettime(3,&local_90);
  if (iVar3 < 0) {
    lVar9 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_90.tv_nsec),8);
    lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_90.tv_sec * -1000000;
  }
  local_38 = Gia_ManFramesForCexMin(p,pCex->iFrame + 1);
  local_40 = (Cnf_Dat_t *)Mf_ManGenerateCnf(local_38,8,0,0,0,0);
  iVar3 = local_40->nVars;
  iVar13 = ~pCex->iFrame * pCex->nPis;
  local_58 = (sat_solver *)Cnf_DataWriteIntoSolver(local_40,1,0);
  local_44 = 3;
  iVar4 = sat_solver_addclause(local_58,&local_44,(lit *)&local_40);
  if (iVar4 != 0) {
    local_60 = (ulong)(uint)(iVar13 + iVar3);
    pVVar6 = (Vec_Int_t *)malloc(0x10);
    pVVar6->nCap = 100;
    pVVar6->nSize = 0;
    piVar7 = (int *)malloc(400);
    pVVar6->pArray = piVar7;
    uVar10 = pCex->nRegs;
    local_70 = pVVar6;
    if ((int)uVar10 < pCex->nBits) {
      iVar3 = (iVar3 + uVar10 + iVar13) * 2;
      do {
        if ((int)(((int)local_60 + uVar10) - pCex->nRegs) < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        Vec_IntPush(local_70,iVar3 + (uint)(((uint)(&pCex[1].iPo)[(int)uVar10 >> 5] >>
                                             (uVar10 & 0x1f) & 1) != 0) + pCex->nRegs * -2 ^ 1);
        uVar10 = uVar10 + 1;
        iVar3 = iVar3 + 2;
      } while ((int)uVar10 < pCex->nBits);
    }
    if (fVerbose != 0) {
      iVar4 = 3;
      iVar3 = clock_gettime(3,&local_90);
      if (iVar3 < 0) {
        lVar12 = -1;
      }
      else {
        lVar12 = local_90.tv_nsec / 1000 + local_90.tv_sec * 1000000;
      }
      Abc_Print(iVar4,"%s =","Constructing SAT solver");
      Abc_Print(iVar4,"%9.2f sec\n",(double)(lVar12 + lVar9) / 1000000.0);
    }
    local_50 = 0;
    __ptr = (uint *)0x0;
    do {
      pVVar6 = local_70;
      if (__ptr != (uint *)0x0) {
        if (*(void **)(__ptr + 2) != (void *)0x0) {
          free(*(void **)(__ptr + 2));
          __ptr[2] = 0;
          __ptr[3] = 0;
        }
        free(__ptr);
      }
      __ptr = (uint *)malloc(0x10);
      uVar10 = pVVar6->nSize;
      lVar9 = (long)(int)uVar10;
      __ptr[1] = uVar10;
      *__ptr = uVar10;
      if (lVar9 == 0) {
        __dest = (void *)0x0;
      }
      else {
        __dest = malloc(lVar9 * 4);
      }
      *(void **)(__ptr + 2) = __dest;
      memcpy(__dest,pVVar6->pArray,lVar9 * 4);
      if (((int)local_50 != 0) && (1 < (int)uVar10)) {
        uVar5 = uVar10 >> 1;
        uVar8 = 0;
        do {
          uVar10 = uVar10 - 1;
          uVar1 = *(undefined4 *)((long)__dest + uVar8 * 4);
          *(undefined4 *)((long)__dest + uVar8 * 4) =
               *(undefined4 *)((long)__dest + (long)(int)uVar10 * 4);
          *(undefined4 *)((long)__dest + (long)(int)uVar10 * 4) = uVar1;
          uVar8 = uVar8 + 1;
        } while (uVar5 != uVar8);
      }
      iVar3 = clock_gettime(3,&local_90);
      psVar2 = local_58;
      if (iVar3 < 0) {
        lVar9 = 1;
      }
      else {
        lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_90.tv_nsec),8);
        lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_90.tv_sec * -1000000;
      }
      local_64 = sat_solver_solve(local_58,*(lit **)(__ptr + 2),*(lit **)(__ptr + 2) + (int)__ptr[1]
                                  ,0,0,0,0);
      piVar7 = (psVar2->conf_final).ptr;
      uVar10 = (psVar2->conf_final).size;
      if (fVerbose != 0) {
        pcVar11 = "BUG";
        if (local_64 == -1) {
          pcVar11 = "OK ";
        }
        printf("Status %s   Selected %5d assumptions out of %5d.  ",pcVar11,(ulong)uVar10);
        iVar4 = 3;
        iVar3 = clock_gettime(3,&local_90);
        if (iVar3 < 0) {
          lVar12 = -1;
        }
        else {
          lVar12 = local_90.tv_nsec / 1000 + local_90.tv_sec * 1000000;
        }
        Abc_Print(iVar4,"%s =","Analyze_final");
        Abc_Print(iVar4,"%9.2f sec\n",(double)(lVar12 + lVar9) / 1000000.0);
      }
      uVar5 = local_7c;
      if ((int)uVar10 < (int)local_7c) {
        if (local_78 != (Abc_Cex_t *)0x0) {
          free(local_78);
        }
        local_78 = Bmc_CexCareDeriveCex(pCex,(int)local_60,piVar7,uVar10);
        uVar5 = uVar10;
      }
      if (local_48 != 0) {
        iVar3 = clock_gettime(3,&local_90);
        if (iVar3 < 0) {
          lVar9 = 1;
        }
        else {
          lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_90.tv_nsec),8);
          lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_90.tv_sec * -1000000;
        }
        uVar10 = sat_solver_minimize_assumptions(local_58,*(int **)(__ptr + 2),__ptr[1],0);
        if (fVerbose != 0) {
          pcVar11 = "BUG";
          if (local_64 == -1) {
            pcVar11 = "OK ";
          }
          printf("Status %s   Selected %5d assumptions out of %5d.  ",pcVar11,(ulong)uVar10,
                 (ulong)__ptr[1]);
          iVar4 = 3;
          iVar3 = clock_gettime(3,&local_90);
          if (iVar3 < 0) {
            lVar12 = -1;
          }
          else {
            lVar12 = local_90.tv_nsec / 1000 + local_90.tv_sec * 1000000;
          }
          Abc_Print(iVar4,"%s =","LEXUNSAT     ");
          Abc_Print(iVar4,"%9.2f sec\n",(double)(lVar12 + lVar9) / 1000000.0);
        }
        if ((int)uVar10 < (int)uVar5) {
          if (local_78 != (Abc_Cex_t *)0x0) {
            free(local_78);
          }
          local_7c = uVar10;
          local_78 = Bmc_CexCareDeriveCex(pCex,(int)local_60,*(int **)(__ptr + 2),uVar10);
          uVar5 = local_7c;
        }
      }
      local_7c = uVar5;
      pVVar6 = local_70;
      iVar3 = (int)local_50;
      local_50 = (ulong)(iVar3 + 1);
    } while (iVar3 == 0);
    if (fVerbose != 0) {
      printf("Final    :    ");
      Bmc_CexPrint(local_78,local_78->nPis,0);
    }
    if (*(void **)(__ptr + 2) != (void *)0x0) {
      free(*(void **)(__ptr + 2));
      __ptr[2] = 0;
      __ptr[3] = 0;
    }
    free(__ptr);
    if (pVVar6->pArray != (int *)0x0) {
      free(pVVar6->pArray);
      pVVar6->pArray = (int *)0x0;
    }
    free(pVVar6);
    sat_solver_delete(local_58);
    Cnf_DataFree(local_40);
    Gia_ManStop(local_38);
    return local_78;
  }
  __assert_fail("status",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCex.c"
                ,0x224,
                "Abc_Cex_t *Bmc_CexCareSatBasedMinimizeAig(Gia_Man_t *, Abc_Cex_t *, int, int)");
}

Assistant:

Abc_Cex_t * Bmc_CexCareSatBasedMinimizeAig( Gia_Man_t * p, Abc_Cex_t * pCex, int fHighEffort, int fVerbose )
{
    abctime clk = Abc_Clock();
    int n, i, iFirstVar, iLit, status;
    Vec_Int_t * vLits = NULL, * vTemp;
    sat_solver * pSat;
    Cnf_Dat_t * pCnf;
    int nFinal, * pFinal;
    Abc_Cex_t * pCexBest = NULL; 
    int CountBest = 0;
    Gia_Man_t * pFrames;

    // CEX minimization
    clk = Abc_Clock();
    pCexBest = Bmc_CexCareMinimizeAig( p, Gia_ManPiNum(p), pCex, 1, 1, fVerbose );
    for ( i = pCexBest->nRegs; i < pCexBest->nBits; i++ )
        CountBest += Abc_InfoHasBit(pCexBest->pData, i);
    if ( fVerbose )
    {
        printf( "Care bits = %d. ", CountBest );
        Abc_PrintTime( 1, "Non-SAT-based CEX minimization", Abc_Clock() - clk );
    }

    // SAT instance
    clk = Abc_Clock();
    pFrames = Gia_ManFramesForCexMin( p, pCex->iFrame + 1 );
    pCnf = (Cnf_Dat_t*)Mf_ManGenerateCnf( pFrames, 8, 0, 0, 0, 0 );
    iFirstVar = pCnf->nVars - (pCex->iFrame+1) * pCex->nPis;
    pSat = (sat_solver*)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    iLit = Abc_Var2Lit( 1, 1 );
    status = sat_solver_addclause( pSat, &iLit, &iLit + 1 );
    assert( status );
    // create literals
    vTemp = Vec_IntAlloc( 100 );
    for ( i = pCex->nRegs; i < pCex->nBits; i++ )
        Vec_IntPush( vTemp, Abc_Var2Lit(iFirstVar + i - pCex->nRegs, !Abc_InfoHasBit(pCex->pData, i)) );
    if ( fVerbose )
    Abc_PrintTime( 1, "Constructing SAT solver", Abc_Clock() - clk );

    for ( n = 0; n < 2; n++ )
    {
        Vec_IntFreeP( &vLits );

        vLits = Vec_IntDup( vTemp );
        if ( n ) Vec_IntReverseOrder( vLits );

        // SAT-based minimization
        clk = Abc_Clock();
        status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits), 0, 0, 0, 0 );
        nFinal = sat_solver_final( pSat, &pFinal );
        if ( fVerbose )
        {
            printf( "Status %s   Selected %5d assumptions out of %5d.  ", status == l_False ? "OK ":"BUG", nFinal, Vec_IntSize(vLits) );
            Abc_PrintTime( 1, "Analyze_final", Abc_Clock() - clk );
        }
        if ( CountBest > nFinal )
        {
            CountBest = nFinal;
            ABC_FREE( pCexBest );
            pCexBest = Bmc_CexCareDeriveCex( pCex, iFirstVar, pFinal, nFinal );
        }
        if ( !fHighEffort )
            continue;

        // SAT-based minimization
        clk = Abc_Clock();
        nFinal = sat_solver_minimize_assumptions( pSat, Vec_IntArray(vLits), Vec_IntSize(vLits), 0 );
        if ( fVerbose )
        {
            printf( "Status %s   Selected %5d assumptions out of %5d.  ", status == l_False ? "OK ":"BUG", nFinal, Vec_IntSize(vLits) );
            Abc_PrintTime( 1, "LEXUNSAT     ", Abc_Clock() - clk );
        }
        if ( CountBest > nFinal )
        {
            CountBest = nFinal;
            ABC_FREE( pCexBest );
            pCexBest = Bmc_CexCareDeriveCex( pCex, iFirstVar, Vec_IntArray(vLits), nFinal );
        }
    }
    if ( fVerbose )
    {
        printf( "Final    :    " );
        Bmc_CexPrint( pCexBest, pCexBest->nPis, 0 );
    }
    // cleanup
    Vec_IntFreeP( &vLits );
    Vec_IntFreeP( &vTemp );
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );
    Gia_ManStop( pFrames );
    return pCexBest;
}